

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

type_conflict2 __thiscall
args::ValueReader::operator()(ValueReader *this,string *name,string *value,long *destination)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  ostream *poVar4;
  ParseError *this_00;
  string local_358;
  ostringstream local_338 [8];
  ostringstream problem;
  istringstream local_1a8 [7];
  bool failed;
  istringstream ss;
  long *destination_local;
  string *value_local;
  string *name_local;
  ValueReader *this_local;
  
  std::__cxx11::istringstream::istringstream(local_1a8,value,8);
  plVar2 = (long *)std::istream::operator>>(local_1a8,destination);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::operator>>(local_1a8,std::ws<char,std::char_traits<char>>);
  }
  std::__cxx11::istringstream::rdbuf();
  lVar3 = std::streambuf::in_avail();
  if ((lVar3 < 1) && ((bVar1 & 1) == 0)) {
    std::__cxx11::istringstream::~istringstream(local_1a8);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream(local_338);
  poVar4 = std::operator<<((ostream *)local_338,"Argument \'");
  poVar4 = std::operator<<(poVar4,(string *)name);
  poVar4 = std::operator<<(poVar4,"\' received invalid value type \'");
  poVar4 = std::operator<<(poVar4,(string *)value);
  std::operator<<(poVar4,"\'");
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  ParseError::ParseError(this_00,&local_358);
  __cxa_throw(this_00,&ParseError::typeinfo,ParseError::~ParseError);
}

Assistant:

typename std::enable_if<!std::is_assignable<T, std::string>::value, bool>::type
        operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            bool failed = !(ss >> destination);

            if (!failed)
            {
                ss >> std::ws;
            }

            if (ss.rdbuf()->in_avail() > 0 || failed)
            {
#ifdef ARGS_NOEXCEPT
                (void)name;
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }